

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaKf.c
# Opt level: O3

void Kf_ObjSetCuts(Kf_Man_t *p,int i,Vec_Int_t *vVec)

{
  int *piVar1;
  word **__ptr;
  word *pwVar2;
  word wVar3;
  int iVar4;
  void *in_RCX;
  int iVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  
  iVar8 = (int)vVec + 1 >> 1;
  iVar5 = 1 << ((byte)(p->pMem).nPageSize & 0x1f);
  if (iVar5 <= iVar8) {
    __assert_fail("nWords < (1 << p->nPageSize)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecSet.h"
                  ,0xd8,"int Vec_SetAppend(Vec_Set_t *, int *, int)");
  }
  piVar1 = &(p->pMem).nEntries;
  *piVar1 = *piVar1 + 1;
  __ptr = (p->pMem).pPages;
  iVar6 = (p->pMem).iPage;
  pwVar2 = __ptr[iVar6];
  iVar4 = (int)*pwVar2;
  if (iVar5 <= iVar8 + iVar4) {
    uVar7 = (long)iVar6 + 1;
    (p->pMem).iPage = (int)uVar7;
    if ((int)uVar7 == (p->pMem).nPagesAlloc) {
      __ptr = (word **)realloc(__ptr,uVar7 * 0x10);
      (p->pMem).pPages = __ptr;
      iVar5 = (p->pMem).nPagesAlloc;
      memset(__ptr + iVar5,0,(long)iVar5 << 3);
      (p->pMem).nPagesAlloc = iVar5 * 2;
      uVar7 = (ulong)(uint)(p->pMem).iPage;
    }
    iVar6 = (int)uVar7;
    pwVar2 = __ptr[iVar6];
    if (pwVar2 == (word *)0x0) {
      pwVar2 = (word *)malloc((0x100000000 << ((byte)(p->pMem).nPageSize & 0x3f)) >> 0x1d);
      __ptr[iVar6] = pwVar2;
      __ptr = (p->pMem).pPages;
      pwVar2 = __ptr[iVar6];
    }
    *pwVar2 = 2;
    pwVar2[1] = 0xffffffffffffffff;
    iVar4 = 2;
  }
  if (in_RCX != (void *)0x0) {
    memcpy(pwVar2 + iVar4,in_RCX,(long)(int)vVec << 2);
    __ptr = (p->pMem).pPages;
    iVar6 = (p->pMem).iPage;
  }
  wVar3 = (long)iVar8 + *__ptr[iVar6];
  *__ptr[iVar6] = wVar3;
  if ((-1 < i) && (i < (p->vCuts).nSize)) {
    (p->vCuts).pArray[(uint)i] =
         (iVar6 << ((byte)(p->pMem).nPageSize & 0x1f)) + ((int)wVar3 - iVar8);
    return;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
}

Assistant:

static inline void  Kf_ObjSetCuts( Kf_Man_t * p, int i, Vec_Int_t * vVec ) { Vec_IntWriteEntry(&p->vCuts, i, Vec_SetAppend(&p->pMem, Vec_IntArray(vVec), Vec_IntSize(vVec)));  }